

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadTable
          (BinaryReader *this,Type *out_elem_type,Limits *out_elem_limits)

{
  Result RVar1;
  char *format;
  uint local_34;
  uint local_30;
  uint32_t flags;
  uint32_t initial;
  uint32_t max;
  
  RVar1 = ReadType(this,out_elem_type,"table elem type");
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  if (*out_elem_type == Anyfunc) {
    flags = 0;
    RVar1 = ReadU32Leb128(this,&local_34,"table flags");
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    RVar1 = ReadU32Leb128(this,&local_30,"table initial elem count");
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    if ((local_34 & 2) == 0) {
      if ((local_34 & 1) == 0) {
        flags = 0;
      }
      else {
        RVar1 = ReadU32Leb128(this,&flags,"table max elem count");
        if (RVar1.enum_ == Error) {
          return (Result)Error;
        }
        if (flags < local_30) {
          format = "table initial elem count must be <= max elem count";
          goto LAB_00d7d65c;
        }
      }
      out_elem_limits->has_max = SUB41(local_34 & 1,0);
      out_elem_limits->initial = (ulong)local_30;
      out_elem_limits->max = (ulong)flags;
      return (Result)Ok;
    }
    format = "tables may not be shared";
  }
  else {
    format = "table elem type must by anyfunc";
  }
LAB_00d7d65c:
  PrintError(this,format);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTable(Type* out_elem_type, Limits* out_elem_limits) {
  CHECK_RESULT(ReadType(out_elem_type, "table elem type"));
  ERROR_UNLESS(*out_elem_type == Type::Anyfunc,
               "table elem type must by anyfunc");

  uint32_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU32Leb128(&flags, "table flags"));
  CHECK_RESULT(ReadU32Leb128(&initial, "table initial elem count"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  ERROR_UNLESS(!is_shared, "tables may not be shared");
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "table max elem count"));
    ERROR_UNLESS(initial <= max,
                 "table initial elem count must be <= max elem count");
  }

  out_elem_limits->has_max = has_max;
  out_elem_limits->initial = initial;
  out_elem_limits->max = max;
  return Result::Ok;
}